

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O2

void __thiscall
vkt::ubo::anon_unknown_0::BlockSingleNestedStructCase::BlockSingleNestedStructCase
          (BlockSingleNestedStructCase *this,TestContext *testCtx,string *name,string *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  ShaderInterface *this_00;
  vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_> *this_01;
  StructType *this_02;
  StructType *this_03;
  UniformBlock *pUVar1;
  allocator<char> local_a1;
  string local_a0;
  VarType local_80;
  Uniform local_68;
  
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,matrixLoadFlag,false)
  ;
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_00bd52d0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"S",(allocator<char> *)&local_a0);
  this_00 = &(this->super_UniformBlockCase).m_interface;
  this_02 = ShaderInterface::allocStruct(this_00,&local_68.m_name);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"a",(allocator<char> *)&local_80);
  VarType::VarType((VarType *)&local_a0,TYPE_INT_VEC3,4);
  StructType::addMember(this_02,&local_68.m_name,(VarType *)&local_a0,0);
  VarType::~VarType((VarType *)&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"b",&local_a1);
  VarType::VarType(&local_80,TYPE_FLOAT_MAT3,2);
  VarType::VarType((VarType *)&local_a0,&local_80,4);
  StructType::addMember(this_02,&local_68.m_name,(VarType *)&local_a0,0);
  VarType::~VarType((VarType *)&local_a0);
  VarType::~VarType(&local_80);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"c",(allocator<char> *)&local_80);
  VarType::VarType((VarType *)&local_a0,TYPE_FLOAT_VEC4,4);
  StructType::addMember(this_02,&local_68.m_name,(VarType *)&local_a0,0x1800);
  VarType::~VarType((VarType *)&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"T",(allocator<char> *)&local_a0);
  this_03 = ShaderInterface::allocStruct(this_00,&local_68.m_name);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"a",(allocator<char> *)&local_80);
  VarType::VarType((VarType *)&local_a0,TYPE_FLOAT_MAT3,2);
  StructType::addMember(this_03,&local_68.m_name,(VarType *)&local_a0,0);
  VarType::~VarType((VarType *)&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"b",(allocator<char> *)&local_80);
  VarType::VarType((VarType *)&local_a0,this_02,0);
  StructType::addMember(this_03,&local_68.m_name,(VarType *)&local_a0,0);
  VarType::~VarType((VarType *)&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Block",(allocator<char> *)&local_a0);
  pUVar1 = ShaderInterface::allocBlock(this_00,&local_68.m_name);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"s",&local_a1);
  VarType::VarType(&local_80,this_02,0);
  Uniform::Uniform(&local_68,&local_a0,&local_80,0);
  this_01 = &pUVar1->m_uniforms;
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_68);
  Uniform::~Uniform(&local_68);
  VarType::~VarType(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"v",&local_a1);
  VarType::VarType(&local_80,TYPE_FLOAT_VEC2,1);
  Uniform::Uniform(&local_68,&local_a0,&local_80,0x1800);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_68);
  Uniform::~Uniform(&local_68);
  VarType::~VarType(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"t",&local_a1);
  VarType::VarType(&local_80,this_03,0);
  Uniform::Uniform(&local_68,&local_a0,&local_80,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_68);
  Uniform::~Uniform(&local_68);
  VarType::~VarType(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"u",&local_a1);
  VarType::VarType(&local_80,TYPE_UINT,4);
  Uniform::Uniform(&local_68,&local_a0,&local_80,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_68);
  Uniform::~Uniform(&local_68);
  VarType::~VarType(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  pUVar1->m_flags = layoutFlags;
  if (0 < numInstances) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"block",(allocator<char> *)&local_a0);
    std::__cxx11::string::_M_assign((string *)&pUVar1->m_instanceName);
    std::__cxx11::string::~string((string *)&local_68);
    pUVar1->m_arraySize = numInstances;
  }
  (*(this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])
            (this);
  return;
}

Assistant:

BlockSingleNestedStructCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: UniformBlockCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH));
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH);

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM));
		typeT.addMember("b", VarType(&typeS));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.addUniform(Uniform("v", VarType(glu::TYPE_FLOAT_VEC2, PRECISION_LOW), UNUSED_BOTH));
		block.addUniform(Uniform("t", VarType(&typeT), 0));
		block.addUniform(Uniform("u", VarType(glu::TYPE_UINT, PRECISION_HIGH), 0));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(numInstances);
		}

		init();
	}